

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

int subprocess::util::read_atmost_n(FILE *fp,char *buf,size_t read_upto)

{
  long lVar1;
  int __fd;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __fd = fileno((FILE *)fp);
  iVar5 = 0;
  iVar6 = 0;
  do {
    while( true ) {
      sVar3 = ::read(__fd,buf + iVar5,read_upto - (long)iVar5);
      iVar2 = (int)sVar3;
      if (iVar2 != -1) break;
      piVar4 = __errno_location();
      if ((*piVar4 != 4) || (0x31 < iVar6)) {
        iVar5 = -1;
        goto LAB_00a63907;
      }
      iVar6 = iVar6 + 1;
    }
    if (iVar2 == 0) {
LAB_00a63907:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return iVar5;
      }
      __stack_chk_fail();
    }
    iVar5 = iVar5 + iVar2;
  } while( true );
}

Assistant:

static inline
  int read_atmost_n(FILE* fp, char* buf, size_t read_upto)
  {
#ifdef __USING_WINDOWS__
    return (int)fread(buf, 1, read_upto, fp);
#else
    int fd = fileno(fp);
    int rbytes = 0;
    int eintr_cnter = 0;

    while (1) {
      int read_bytes = read(fd, buf + rbytes, read_upto - rbytes);
      if (read_bytes == -1) {
        if (errno == EINTR) {
          if (eintr_cnter >= 50) return -1;
          eintr_cnter++;
          continue;
        }
        return -1;
      }
      if (read_bytes == 0) return rbytes;

      rbytes += read_bytes;
    }
    return rbytes;
#endif
  }